

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall WriterTest_Data_Test::TestBody(WriterTest_Data_Test *this)

{
  locale_ref loc;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  AssertionResult gtest_ar;
  writer w;
  memory_buffer buf;
  allocator<char> *in_stack_fffffffffffffd48;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> out;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  char *in_stack_fffffffffffffd70;
  string local_288 [4];
  Type in_stack_fffffffffffffd7c;
  AssertHelper *in_stack_fffffffffffffd80;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  AssertionResult local_268;
  locale_ref local_258 [2];
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_248;
  Message *in_stack_fffffffffffffdc8;
  AssertHelper *in_stack_fffffffffffffdd0;
  basic_buffer<char> local_221 [17];
  
  out.container = local_221;
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>::back_insert_range
            ((back_insert_range<fmt::v5::internal::basic_buffer<char>_> *)out.container,
             (basic_buffer<char> *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  fmt::v5::internal::locale_ref::locale_ref(local_258);
  loc.locale_._7_1_ = in_stack_fffffffffffffd5f;
  loc.locale_._0_7_ = in_stack_fffffffffffffd58;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  basic_writer((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
               in_stack_fffffffffffffd50,
               (back_insert_range<fmt::v5::internal::basic_buffer<char>_>)out.container,loc);
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&local_248,0x2a,__buf,in_RCX);
  fmt::v5::to_string<char,500ul>(in_stack_fffffffffffffd88);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (char *)out.container,
             (char (*) [3])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd50 =
         (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x128de0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70,
               in_stack_fffffffffffffd6c,(char *)out.container);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x128e2e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128e7a);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffd50);
  return;
}

Assistant:

TEST(WriterTest, Data) {
  memory_buffer buf;
  fmt::writer w(buf);
  w.write(42);
  EXPECT_EQ("42", to_string(buf));
}